

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessor::tryAddCardsOnAnyTableauPile
          (EventsProcessor *this,MouseLeftButtonUpEventData *eventData)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  PileId id;
  int iVar3;
  undefined8 local_38;
  EventsProcessor *this_00;
  
  iVar3 = 0;
  local_38 = in_RAX;
  do {
    if (iVar3 == 7) {
      return;
    }
    local_38 = CONCAT44(iVar3,local_38._0_4_);
    iVar2 = (*this->context->_vptr_Context[8])(this->context,(long)&local_38 + 4);
    this_00 = (EventsProcessor *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(this_00->super_EventsProcessor)._vptr_EventsProcessor[3])
                      (this_00,&eventData->cardsInHandPosition);
    if ((char)iVar2 != '\0') {
      local_38 = CONCAT44(local_38._4_4_,iVar3);
      bVar1 = tryAddCardOnTableauPileAndCheckIfHandEmpty(this_00,(PileId *)&local_38,eventData);
      if (bVar1) {
        return;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void EventsProcessor::tryAddCardsOnAnyTableauPile(
    const MouseLeftButtonUpEventData& eventData) const
{
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id) {
        const auto& collider = context.getTableauPileCollider(id);
        if (collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
            tryAddCardOnTableauPileAndCheckIfHandEmpty(id, eventData))
            return;
    }
}